

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

EdgeIter __thiscall CMU462::HalfedgeMesh::flipEdge(HalfedgeMesh *this,EdgeIter e0)

{
  HalfedgeIter x;
  HalfedgeIter x_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  HalfedgeIter HVar5;
  HalfedgeIter HVar6;
  
  x._M_node = e0._M_node[6]._M_prev;
  x_00._M_node = x._M_node[1]._M_prev;
  p_Var1 = x._M_node[2]._M_next;
  p_Var2 = p_Var1[2]._M_next;
  p_Var3 = x_00._M_node[2]._M_next;
  p_Var4 = p_Var3[2]._M_next;
  HVar5 = prev_Halfedge(x);
  HVar6 = prev_Halfedge(x_00);
  x._M_node[2]._M_prev[0xf]._M_prev = p_Var3;
  x_00._M_node[2]._M_prev[0xf]._M_prev = p_Var1;
  x._M_node[3]._M_prev[0xb]._M_prev = x._M_node;
  x_00._M_node[3]._M_prev[0xb]._M_prev = x_00._M_node;
  x._M_node[2]._M_prev = p_Var4[2]._M_prev;
  x_00._M_node[2]._M_prev = p_Var2[2]._M_prev;
  x._M_node[2]._M_next = p_Var2;
  HVar5._M_node[2]._M_next = p_Var3;
  p_Var3[2]._M_next = x._M_node;
  x_00._M_node[2]._M_next = p_Var4;
  HVar6._M_node[2]._M_next = p_Var1;
  p_Var1[2]._M_next = x_00._M_node;
  p_Var1[3]._M_prev = x_00._M_node[3]._M_prev;
  p_Var3[3]._M_prev = x._M_node[3]._M_prev;
  return (EdgeIter)e0._M_node;
}

Assistant:

EdgeIter HalfedgeMesh::flipEdge(EdgeIter e0) {
	// TODO: (meshEdit)
	// This method should flip the given edge and return an iterator to the
	// flipped edge.

	HalfedgeIter h1 = e0->halfedge();
	HalfedgeIter h2 = h1->twin();
	HalfedgeIter h1_next = h1->next();
	HalfedgeIter h1_next_next = h1->next()->next();
	HalfedgeIter h2_next = h2->next();
	HalfedgeIter h2_next_next = h2->next()->next();
	HalfedgeIter h1_prev = prev_Halfedge(h1);
	HalfedgeIter h2_prev = prev_Halfedge(h2);

	h1->vertex()->halfedge() = h2_next;
	h2->vertex()->halfedge() = h1_next;
	h1->face()->halfedge() = h1;
	h2->face()->halfedge() = h2;

	h1->vertex() = h2_next_next->vertex();
	h2->vertex() = h1_next_next->vertex();

	h1->next() = h1_next_next;
	h1_prev->next() = h2_next;
	h2_next->next() = h1;
	h2->next() = h2_next_next;
	h2_prev->next() = h1_next;
	h1_next->next() = h2;

	h1_next->face() = h2->face();
	h2_next->face() = h1->face();

	//showError("flipEdge() not implemented.");
	return e0;
}